

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::base_text::load(base_text *this,context *context)

{
  char *begin;
  bool bVar1;
  request *prVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  const_iterator cVar3;
  form_type *pfVar4;
  key_type kStack_48;
  
  base_widget::pre_load
            ((base_widget *)((long)&this->_vptr_base_text + (long)this->_vptr_base_text[-3]),context
            );
  (this->value_)._M_string_length = 0;
  *(this->value_)._M_dataplus._M_p = '\0';
  this->code_points_ = 0;
  *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) =
       *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) | 2;
  *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) =
       *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) | 1;
  std::__cxx11::string::string
            ((string *)&kStack_48,(string *)((long)&this->low_ + (long)this->_vptr_base_text[-3]));
  std::__cxx11::string::~string((string *)&kStack_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)kStack_48._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    prVar2 = http::context::request(context);
    this_00 = &http::request::post_or_get_abi_cxx11_(prVar2)->_M_t;
    std::__cxx11::string::string
              ((string *)&kStack_48,(string *)((long)&this->low_ + (long)this->_vptr_base_text[-3]))
    ;
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(this_00,&kStack_48);
    std::__cxx11::string::~string((string *)&kStack_48);
    prVar2 = http::context::request(context);
    pfVar4 = http::request::post_or_get_abi_cxx11_(prVar2);
    if ((_Rb_tree_header *)cVar3._M_node != &(pfVar4->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)&this->value_);
      if (this->validate_charset_ == true) {
        this->code_points_ = 0;
        http::context::locale((context *)&kStack_48);
        begin = (this->value_)._M_dataplus._M_p;
        bVar1 = encoding::valid((locale *)&kStack_48,begin,begin + (this->value_)._M_string_length,
                                &this->code_points_);
        std::locale::~locale((locale *)&kStack_48);
        if (!bVar1) {
          *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) =
               *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) & 0xfffffffe;
        }
      }
      else {
        this->code_points_ = (this->value_)._M_string_length;
      }
    }
  }
  return;
}

Assistant:

void base_text::load(http::context &context)
{
	pre_load(context);
	value_.clear();
	code_points_ = 0;
	set(true); // we don't care if the value was set
	valid(true);
	if(name().empty()) {
		return;
	}
	http::request::form_type::const_iterator p;
	p=context.request().post_or_get().find(name());
	if(p==context.request().post_or_get().end()) {
		return;	
	}
	value_=p->second;
	if(validate_charset_) {
		code_points_ = 0;
		if(!encoding::valid(context.locale(),value_.data(),value_.data()+value_.size(),code_points_))
			valid(false);
	}
	else {
		code_points_=value_.size();
	}
}